

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

bool __thiscall
irr::video::CNullDriver::setRenderTarget
          (CNullDriver *this,ITexture *texture,u16 clearFlag,SColor clearColor,f32 clearDepth,
          u8 clearStencil)

{
  bool bVar1;
  byte bVar2;
  u32 uVar3;
  long lVar4;
  ITexture **ppIVar5;
  undefined4 in_ECX;
  undefined2 in_DX;
  ITexture *in_RSI;
  long *in_RDI;
  undefined1 in_R8B;
  undefined4 in_XMM0_Da;
  u32 i;
  ITexture *depthTexture;
  undefined4 in_stack_ffffffffffffff78;
  u32 in_stack_ffffffffffffff7c;
  ITexture *in_stack_ffffffffffffff80;
  ITexture *in_stack_ffffffffffffff88;
  uint uVar6;
  undefined1 local_58 [36];
  uint local_34;
  ITexture *local_30;
  undefined1 local_21;
  undefined4 local_20;
  undefined2 local_1a;
  ITexture *local_18;
  undefined4 local_8;
  bool local_1;
  
  if (in_RSI == (ITexture *)0x0) {
    bVar2 = (**(code **)(*in_RDI + 0x138))(in_XMM0_Da,in_RDI,0,in_DX,in_ECX,in_R8B);
  }
  else {
    local_21 = in_R8B;
    local_20 = in_XMM0_Da;
    local_1a = in_DX;
    local_18 = in_RSI;
    local_8 = in_ECX;
    if (in_RDI[0xe] == 0) {
      lVar4 = (**(code **)(*in_RDI + 0x110))();
      in_RDI[0xe] = lVar4;
    }
    local_30 = (ITexture *)0x0;
    local_34 = 0;
    while( true ) {
      uVar6 = local_34;
      uVar3 = core::array<irr::video::ITexture_*>::size((array<irr::video::ITexture_*> *)0x30a4d7);
      if (uVar3 <= uVar6) break;
      ppIVar5 = core::array<irr::video::ITexture_*>::operator[]
                          ((array<irr::video::ITexture_*> *)in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff7c);
      in_stack_ffffffffffffff88 = (ITexture *)ITexture::getSize(*ppIVar5);
      ITexture::getSize(local_18);
      bVar1 = core::dimension2d<unsigned_int>::operator==
                        ((dimension2d<unsigned_int> *)CONCAT44(in_ECX,uVar6),
                         (dimension2d<unsigned_int> *)in_stack_ffffffffffffff88);
      if (bVar1) {
        ppIVar5 = core::array<irr::video::ITexture_*>::operator[]
                            ((array<irr::video::ITexture_*> *)in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff7c);
        local_30 = *ppIVar5;
        break;
      }
      local_34 = local_34 + 1;
    }
    if (local_30 == (ITexture *)0x0) {
      in_stack_ffffffffffffff80 = (ITexture *)ITexture::getSize(local_18);
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff80,
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      local_30 = (ITexture *)
                 (**(code **)(*in_RDI + 0xa0))(in_RDI,in_stack_ffffffffffffff80,local_58,0x10);
      core::string<char>::~string((string<char> *)0x30a59f);
      core::array<irr::video::ITexture_*>::push_back
                ((array<irr::video::ITexture_*> *)in_stack_ffffffffffffff80,
                 (ITexture **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    IRenderTarget::setTexture
              ((IRenderTarget *)CONCAT44(in_ECX,uVar6),in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80);
    bVar2 = (**(code **)(*in_RDI + 0x138))(local_20,in_RDI,in_RDI[0xe],local_1a,local_8,local_21);
  }
  local_1 = (bool)(bVar2 & 1);
  return local_1;
}

Assistant:

bool CNullDriver::setRenderTarget(ITexture *texture, u16 clearFlag, SColor clearColor, f32 clearDepth, u8 clearStencil)
{
	if (texture) {
		// create render target if require.
		if (!SharedRenderTarget)
			SharedRenderTarget = addRenderTarget();

		ITexture *depthTexture = 0;

		// try to find available depth texture with require size.
		for (u32 i = 0; i < SharedDepthTextures.size(); ++i) {
			if (SharedDepthTextures[i]->getSize() == texture->getSize()) {
				depthTexture = SharedDepthTextures[i];

				break;
			}
		}

		// create depth texture if require.
		if (!depthTexture) {
			depthTexture = addRenderTargetTexture(texture->getSize(), "IRR_DEPTH_STENCIL", video::ECF_D24S8);
			SharedDepthTextures.push_back(depthTexture);
		}

		SharedRenderTarget->setTexture(texture, depthTexture);

		return setRenderTargetEx(SharedRenderTarget, clearFlag, clearColor, clearDepth, clearStencil);
	} else {
		return setRenderTargetEx(0, clearFlag, clearColor, clearDepth, clearStencil);
	}
}